

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O0

void __thiscall slang::JsonWriter::writeQuoted(JsonWriter *this,string_view str)

{
  span<char,_18446744073709551615UL> text;
  string_view str_00;
  size_type sVar1;
  char *in_RDI;
  string_view sVar2;
  char buf [5];
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string_view *__range1;
  SmallVector<char,_40UL> vec;
  char *in_stack_ffffffffffffff08;
  SmallVectorBase<char> *in_stack_ffffffffffffff10;
  SmallVector<char,_40UL> *in_stack_ffffffffffffff18;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  char *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  SmallVectorBase<char> *in_stack_ffffffffffffff50;
  char local_9c [5];
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  char local_89;
  char *local_88;
  char *local_80;
  basic_string_view<char,_std::char_traits<char>_> *local_78;
  undefined1 local_5a;
  SmallVector<char,_40UL> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
  SmallVector<char,_40UL>::SmallVector(&local_58,sVar1 + 2);
  local_5a = 0x22;
  SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_78 = &local_10;
  local_80 = std::basic_string_view<char,_std::char_traits<char>_>::begin(local_78);
  local_88 = std::basic_string_view<char,_std::char_traits<char>_>::end(local_78);
  for (; local_80 != local_88; local_80 = local_80 + 1) {
    local_89 = *local_80;
    in_stack_ffffffffffffff2c = (int)local_89;
    if (in_stack_ffffffffffffff2c == 8) {
      local_8e = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_8f = 0x62;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else if (in_stack_ffffffffffffff2c == 9) {
      local_96 = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_97 = 0x74;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else if (in_stack_ffffffffffffff2c == 10) {
      local_92 = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_93 = 0x6e;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else if (in_stack_ffffffffffffff2c == 0xc) {
      local_90 = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_91 = 0x66;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else if (in_stack_ffffffffffffff2c == 0xd) {
      local_94 = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_95 = 0x72;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else if (in_stack_ffffffffffffff2c == 0x22) {
      local_8a = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_8b = 0x22;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else if (in_stack_ffffffffffffff2c == 0x5c) {
      local_8c = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      local_8d = 0x5c;
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else if ((local_89 < '\0') || ('\x1f' < local_89)) {
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      snprintf(local_9c,5,"%04x",(ulong)(uint)(int)local_89);
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      SmallVectorBase<char>::append<char_*>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
  }
  SmallVectorBase<char>::push_back(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
            ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)0x327b1b)
  ;
  std::span<char,_18446744073709551615UL>::span<slang::SmallVector<char,_40UL>_&>
            ((span<char,_18446744073709551615UL> *)in_stack_ffffffffffffff20._M_extent_value,
             in_stack_ffffffffffffff18);
  text._M_extent._M_extent_value = in_stack_ffffffffffffff20._M_extent_value;
  text._M_ptr = (pointer)in_stack_ffffffffffffff18;
  sVar2 = toStringView(text);
  str_00._M_len._4_4_ = in_stack_ffffffffffffff2c;
  str_00._M_len._0_4_ = in_stack_ffffffffffffff28;
  str_00._M_str = in_RDI;
  FormatBuffer::append((FormatBuffer *)sVar2._M_len,str_00);
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x327b84);
  return;
}

Assistant:

void JsonWriter::writeQuoted(std::string_view str) {
    SmallVector<char> vec(str.size() + 2, UninitializedTag());
    vec.push_back('"');
    for (char c : str) {
        switch (c) {
            case '"':
                vec.push_back('\\');
                vec.push_back('"');
                break;
            case '\\':
                vec.push_back('\\');
                vec.push_back('\\');
                break;
            case '\b':
                vec.push_back('\\');
                vec.push_back('b');
                break;
            case '\f':
                vec.push_back('\\');
                vec.push_back('f');
                break;
            case '\n':
                vec.push_back('\\');
                vec.push_back('n');
                break;
            case '\r':
                vec.push_back('\\');
                vec.push_back('r');
                break;
            case '\t':
                vec.push_back('\\');
                vec.push_back('t');
                break;
            default:
#if CHAR_MIN < 0
                if (c >= 0x00 and c <= 0x1f) {
#else
                if (c <= 0x1f) {
#endif
                    // print character c as \uxxxx
                    char buf[5];
                    snprintf(buf, sizeof(buf), "%04x", int(c));
                    vec.push_back('\\');
                    vec.push_back('u');
                    vec.append(buf, buf + 4);
                }
                else {
                    // all other characters are added as-is
                    vec.push_back(c);
                }
                break;
        }
    }

    vec.push_back('"');
    buffer->append(toStringView(vec));
}

void JsonWriter::endValue() {
    buffer->append(",");
    if (pretty)
        buffer->format("\n{:{}}", "", currentIndent);
}

size_t JsonWriter::findLastComma() const {
    size_t size = buffer->size();
    if (pretty) {
        while (size && (buffer->data()[size - 1] == ' ' || buffer->data()[size - 1] == '\n'))
            size--;
    }

    if (size && buffer->data()[size - 1] == ',')
        size--;

    return size;
}

}